

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O2

bool __thiscall QPlainTextEditSearchWidget::doReplace(QPlainTextEditSearchWidget *this,bool forAll)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  MoveMode MVar4;
  bool bVar5;
  QTextCursor cursor;
  QRegularExpression local_68;
  QString text;
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_30;
  
  cVar1 = QPlainTextEdit::isReadOnly();
  if (cVar1 != '\0') {
    return false;
  }
  QPlainTextEdit::textCursor();
  if (!forAll) {
    QTextCursor::selectedText();
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&text.d);
    if (text.d.size == 0) {
      bVar5 = false;
      goto LAB_001173d4;
    }
  }
  iVar3 = QComboBox::currentIndex();
  if (iVar3 == 2) {
    QTextCursor::selectedText();
    QLineEdit::text();
    QRegularExpression::QRegularExpression(&local_68,&local_30,0);
    QLineEdit::text();
    QString::replace((QRegularExpression *)&text,(QString *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QRegularExpression::~QRegularExpression(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
    QTextCursor::insertText((QString *)&cursor);
  }
  else {
    QLineEdit::text();
    QTextCursor::insertText((QString *)&cursor);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&text.d);
  bVar5 = true;
  if (!forAll) {
    MVar4 = QTextCursor::position();
    bVar2 = doSearch(this,true,true,true);
    if (!bVar2) {
      QTextCursor::setPosition((int)&cursor,MVar4);
      QPlainTextEdit::setTextCursor(*(QTextCursor **)(this + 0x88));
    }
  }
LAB_001173d4:
  QTextCursor::~QTextCursor(&cursor);
  return bVar5;
}

Assistant:

bool QPlainTextEditSearchWidget::doReplace(bool forAll) {
    if (_textEdit->isReadOnly()) {
        return false;
    }

    QTextCursor cursor = _textEdit->textCursor();

    if (!forAll && cursor.selectedText().isEmpty()) {
        return false;
    }

    const int searchMode = ui->modeComboBox->currentIndex();
    if (searchMode == RegularExpressionMode) {
        QString text = cursor.selectedText();
        text.replace(QRegularExpression(ui->searchLineEdit->text()),
                     ui->replaceLineEdit->text());
        cursor.insertText(text);
    } else {
        cursor.insertText(ui->replaceLineEdit->text());
    }

    if (!forAll) {
        const int position = cursor.position();

        if (!doSearch(true)) {
            // restore the last cursor position if text wasn't found any more
            cursor.setPosition(position);
            _textEdit->setTextCursor(cursor);
        }
    }

    return true;
}